

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O0

void pnga_zero_patch(Integer g_a,Integer *lo,Integer *hi)

{
  int iVar1;
  int iVar2;
  int local_sync_end;
  int local_sync_begin;
  void *valptr;
  float fval;
  SingleComplex cfval;
  DoubleComplex cval;
  double dval;
  long llval;
  long lval;
  int ival;
  Integer type;
  Integer dims [7];
  Integer ndim;
  Integer in_stack_000000e8;
  char *in_stack_000000f0;
  Integer *in_stack_00000158;
  Integer *in_stack_00000160;
  Integer *in_stack_00000168;
  Integer in_stack_00000170;
  void *in_stack_000003d8;
  Integer *in_stack_000003e0;
  Integer *in_stack_000003e8;
  Integer in_stack_000003f0;
  undefined8 local_60;
  
  iVar2 = _ga_sync_end;
  iVar1 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar1 != 0) {
    pnga_sync();
  }
  pnga_inquire(in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_00000158);
  switch(local_60) {
  case 0x3e9:
    break;
  case 0x3ea:
    break;
  case 0x3eb:
    break;
  case 0x3ec:
    break;
  default:
    pnga_error(in_stack_000000f0,in_stack_000000e8);
    break;
  case 0x3ee:
    break;
  case 0x3ef:
    break;
  case 0x3f8:
  }
  pnga_fill_patch(in_stack_000003f0,in_stack_000003e8,in_stack_000003e0,in_stack_000003d8);
  if (iVar2 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_zero_patch(Integer g_a, Integer *lo, Integer *hi)
{
    Integer ndim, dims[MAXDIM], type;
    int ival = 0;
    long lval = 0; 
    long llval = 0; 
    double dval = 0.0;
    DoubleComplex cval;
    SingleComplex cfval;
    float fval = 0.0;
    void *valptr = NULL;
    int local_sync_begin,local_sync_end;
    
    local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if(local_sync_begin)pnga_sync();

    
    pnga_inquire(g_a,  &type, &ndim, dims);
    
    switch (type){
        case C_INT:
            valptr = (void *)(&ival);
            break;
        case C_DBL:
            valptr = (void *)(&dval);
            break;
        case C_DCPL:
        {
            cval.real = 0.0; cval.imag = 0.0;
            valptr = (void *)(&cval);
            break;
        }
        case C_SCPL:
        {
            cfval.real = 0.0; cfval.imag = 0.0;
            valptr = (void *)(&cfval);
            break;
        }
        case C_FLOAT:
            valptr = (void *)(&fval);
            break;      
       case C_LONG:
            valptr = (void *)(&lval);
            break; 
       case C_LONGLONG:
            valptr = (void *)(&llval);
            break; 
        default: pnga_error(" wrong data type ",type);
    }
    pnga_fill_patch(g_a, lo, hi, valptr);
    
    if(local_sync_end)pnga_sync();
}